

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_finalize(Context *ctx)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char buf [64];
  char acStack_78 [72];
  
  push_output(ctx,&ctx->preflight);
  if ((ctx->shader_type == MOJOSHADER_TYPE_VERTEX) && (ctx->arb1_wrote_position == 0)) {
    output_line(ctx,"OPTION ARB_position_invariant;");
  }
  if ((ctx->shader_type == MOJOSHADER_TYPE_PIXEL) && (ctx->have_multi_color_outputs != 0)) {
    output_line(ctx,"OPTION ARB_draw_buffers;");
  }
  lVar3 = (long)ctx->output_stack_len;
  if (0 < lVar3) {
    ctx->output_stack_len = (int)(lVar3 - 1U);
    ctx->output = ctx->output_stack[lVar3 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar3 + -1];
    pcVar8 = "FLOAT TEMP";
    if (ctx->profile_supports_nv4 == 0) {
      pcVar8 = "TEMP";
    }
    push_output(ctx,&ctx->globals);
    iVar2 = ctx->max_scratch_registers;
    if (0 < iVar2) {
      iVar5 = 0;
      do {
        iVar1 = ctx->scratch_registers;
        iVar4 = iVar1 + 1;
        ctx->scratch_registers = iVar4;
        if (iVar2 <= iVar1) {
          ctx->max_scratch_registers = iVar4;
        }
        snprintf(acStack_78,0x40,"scratch%d");
        output_line(ctx,"%s %s;",pcVar8,acStack_78);
        iVar5 = iVar5 + 1;
        iVar2 = ctx->max_scratch_registers;
      } while (iVar5 < iVar2);
    }
    if ((((ctx->profile_supports_nv2 != 0) && (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) &&
        (ctx->profile_supports_nv4 == 0)) && (0 < ctx->max_reps)) {
      uVar7 = 0;
      do {
        output_line(ctx,"TEMP rep%d;",uVar7);
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
      } while ((int)uVar6 < ctx->max_reps);
    }
    iVar2 = ctx->output_stack_len;
    if (0 < (long)iVar2) {
      ctx->output_stack_len = iVar2 - 1U;
      ctx->output = ctx->output_stack[iVar2 - 1U];
      ctx->indent = ctx->indent_stack[(long)iVar2 + -1];
      if (ctx->scratch_registers == ctx->max_scratch_registers) {
        return;
      }
      __assert_fail("ctx->scratch_registers == ctx->max_scratch_registers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1b38,"void emit_ARB1_finalize(Context *)");
    }
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_finalize(Context *ctx)
{
    push_output(ctx, &ctx->preflight);

    if (shader_is_vertex(ctx) && !ctx->arb1_wrote_position)
        output_line(ctx, "OPTION ARB_position_invariant;");

    if (shader_is_pixel(ctx) && ctx->have_multi_color_outputs)
        output_line(ctx, "OPTION ARB_draw_buffers;");

    pop_output(ctx);

    const char *tmpstr = arb1_float_temp(ctx);
    int i;
    push_output(ctx, &ctx->globals);
    for (i = 0; i < ctx->max_scratch_registers; i++)
    {
        char buf[64];
        allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "%s %s;", tmpstr, buf);
    } // for

    // nv2 fragment programs (and anything nv4) have a real REP/ENDREP.
    if ( (support_nv2(ctx)) && (!shader_is_pixel(ctx)) && (!support_nv4(ctx)) )
    {
        // set up temps for nv2 REP/ENDREP emulation through branching.
        for (i = 0; i < ctx->max_reps; i++)
            output_line(ctx, "TEMP rep%d;", i);
    } // if

    pop_output(ctx);
    assert(ctx->scratch_registers == ctx->max_scratch_registers);
}